

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O1

int mapRiverMix(Layer *l,int *out,int x,int z,int w,int h)

{
  char cVar1;
  uint id;
  PerlinNoise *noise;
  int iVar2;
  uint uVar3;
  int extraout_EDX;
  long lVar4;
  long lVar5;
  double dVar6;
  
  if (l->p2 != (Layer *)0x0) {
    iVar2 = (*l->p->getMap)(l->p,out,x,z,w,h);
    if (iVar2 == 0) {
      lVar5 = (long)h * (long)w;
      cVar1 = l->mc;
      iVar2 = (*l->p2->getMap)(l->p2,out + lVar5,x,z,w,h);
      if (iVar2 == 0) {
        if (0 < lVar5) {
          lVar4 = 0;
          do {
            id = out[lVar4];
            uVar3 = id;
            if (((((out + lVar5)[lVar4] == 7) && (id != 0)) &&
                ((cVar1 < '\n' || (iVar2 = isOceanic(id), iVar2 == 0)))) && (uVar3 = 0xb, id != 0xc)
               ) {
              uVar3 = (uint)((id & 0xfffffffe) == 0xe) * 8 + 7;
            }
            out[lVar4] = uVar3;
            lVar4 = lVar4 + 1;
          } while (lVar5 - lVar4 != 0);
        }
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  mapRiverMix_cold_1();
  if (0 < h) {
    noise = (PerlinNoise *)l->noise;
    lVar5 = 0;
    do {
      if (0 < w) {
        lVar4 = 0;
        do {
          dVar6 = samplePerlin(noise,(double)(lVar4 + extraout_EDX) * 0.125,
                               (double)(z + lVar5) * 0.125,0.0,0.0,0.0);
          iVar2 = 0x2c;
          if ((((dVar6 <= 0.4) && (iVar2 = 0x2d, dVar6 <= 0.2)) && (iVar2 = 10, -0.4 <= dVar6)) &&
             (iVar2 = 0, dVar6 < -0.2)) {
            iVar2 = 0x2e;
          }
          out[lVar5 * w + lVar4] = iVar2;
          lVar4 = lVar4 + 1;
        } while (w != lVar4);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != h);
  }
  return 0;
}

Assistant:

int mapRiverMix(const Layer * l, int * out, int x, int z, int w, int h)
{
    if unlikely(l->p2 == NULL)
    {
        printf("mapRiverMix() requires two parents! Use setupMultiLayer()\n");
        exit(1);
    }

    int err = l->p->getMap(l->p, out, x, z, w, h); // biome chain
    if unlikely(err != 0)
        return err;

    int64_t len = w*(int64_t)h;
    int64_t idx;
    int mc = l->mc;
    int *buf = out + len;

    err = l->p2->getMap(l->p2, buf, x, z, w, h); // rivers
    if unlikely(err != 0)
        return err;


    for (idx = 0; idx < len; idx++)
    {
        int v = out[idx];

        if (buf[idx] == river && v != ocean && (mc <= MC_1_6 || !isOceanic(v)))
        {
            if (v == snowy_tundra)
                v = frozen_river;
            else if (v == mushroom_fields || v == mushroom_field_shore)
                v = mushroom_field_shore;
            else
                v = river;
        }

        out[idx] = v;
    }

    return 0;
}